

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::sumRows(Histogram *this,Histogram *colhist)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  setSize(colhist,*(int *)this,1,*(int *)(this + 8));
  if (0 < *(int *)(colhist + 4) * *(int *)colhist) {
    memset(*(void **)(colhist + 0x10),0,(ulong)(uint)(*(int *)(colhist + 4) * *(int *)colhist) << 3)
    ;
  }
  iVar2 = *(int *)(this + 4);
  if (0 < (long)iVar2) {
    uVar3 = *(uint *)this;
    lVar4 = *(long *)(this + 0x18);
    lVar5 = *(long *)(colhist + 0x18);
    lVar8 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar6 = *(long *)(lVar4 + lVar8 * 8);
        lVar7 = *(long *)(lVar5 + 8);
        uVar9 = 0;
        do {
          plVar1 = (long *)(lVar7 + uVar9 * 8);
          *plVar1 = *plVar1 + *(long *)(lVar6 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return;
}

Assistant:

void Histogram::sumRows(Histogram &colhist) const
{
  colhist.setSize(w, 1, bs);
  colhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      colhist(i, 1)+=row[k][i];
    }
  }
}